

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O2

void touch_file(char *path)

{
  FILE *__stream;
  int iVar1;
  bool bVar2;
  
  __stream = fopen64("testfile","w+");
  if (__stream != (FILE *)0x0) {
    iVar1 = touch_file::count + 1;
    touch_file::count = iVar1;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      fputc(0x2a,__stream);
    }
    fclose(__stream);
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-poll.c"
          ,0x3b,"(fp = fopen(FIXTURE, \"w+\"))");
  abort();
}

Assistant:

static void touch_file(const char* path) {
  static int count;
  FILE* fp;
  int i;

  ASSERT((fp = fopen(FIXTURE, "w+")));

  /* Need to change the file size because the poller may not pick up
   * sub-second mtime changes.
   */
  i = ++count;

  while (i--)
    fputc('*', fp);

  fclose(fp);
}